

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMapInfo.h
# Opt level: O1

uint llvm::DenseMapInfo<llvm::StringRef>::getHashValue(StringRef Val)

{
  hash_code hVar1;
  size_t in_RDX;
  llvm *this;
  StringRef S;
  
  S.Data = (char *)Val.Length;
  this = (llvm *)Val.Data;
  if (this == (llvm *)0xfffffffffffffffe) {
    __assert_fail("Val.data() != getTombstoneKey().data() && \"Cannot hash the tombstone key!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMapInfo.h"
                  ,0x11c,
                  "static unsigned int llvm::DenseMapInfo<llvm::StringRef>::getHashValue(StringRef)"
                 );
  }
  if (this != (llvm *)0xffffffffffffffff) {
    S.Length = in_RDX;
    hVar1 = hash_value(this,S);
    return (uint)hVar1.value;
  }
  __assert_fail("Val.data() != getEmptyKey().data() && \"Cannot hash the empty key!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMapInfo.h"
                ,0x11a,
                "static unsigned int llvm::DenseMapInfo<llvm::StringRef>::getHashValue(StringRef)");
}

Assistant:

static unsigned getHashValue(StringRef Val) {
    assert(Val.data() != getEmptyKey().data() && "Cannot hash the empty key!");
    assert(Val.data() != getTombstoneKey().data() &&
           "Cannot hash the tombstone key!");
    return (unsigned)(hash_value(Val));
  }